

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

CmdArgument<bool> * __thiscall
cli::Parser::CmdArgument<bool>::print_value_abi_cxx11_(CmdArgument<bool> *this)

{
  long in_RSI;
  CmdArgument<bool> *this_local;
  
  stringify<bool>((Parser *)this,(bool *)(in_RSI + 0xa8));
  return this;
}

Assistant:

virtual std::string print_value() const {
				return stringify(value);
			}